

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void __thiscall
flatbuffers::php::PhpGenerator::GetMemberOfVectorOfStruct
          (PhpGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  size_t sVar1;
  Type *type;
  Type *type_00;
  Type *type_01;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  Type vectortype;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PhpGenerator *this_local;
  
  vectortype._24_8_ = code_ptr;
  Type::VectorType((Type *)local_50,&(field->value).type);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return");
  GenTypeBasic_abi_cxx11_(&local_100,(PhpGenerator *)&field->value,type);
  std::operator+(&local_c0,&local_e0,&local_100);
  std::operator+(&local_a0,&local_c0,"\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::operator+(&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public function get");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  ConvertCase(&local_160,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"($j)\n");
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_1e0,&local_200,"$o = $this->__offset(");
  NumToString<unsigned_short>(&local_220,(field->value).offset);
  std::operator+(&local_1c0,&local_1e0,&local_220);
  std::operator+(&local_1a0,&local_1c0,");\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::operator+(&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_240,&local_260,"$obj = new ");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  GenTypeGet_abi_cxx11_(&local_2c0,(PhpGenerator *)&field->value,type_00);
  ConvertCase(&local_2a0,&local_2c0,kUpperCamel,kSnake);
  std::operator+(&local_280,&local_2a0,"();\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  switch((field->value).type.base_type) {
  case BASE_TYPE_STRING:
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,"// base_type_string\n");
    break;
  case BASE_TYPE_VECTOR:
    if (local_50._0_4_ == BASE_TYPE_STRUCT) {
      std::operator+(&local_3c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_);
      std::operator+(&local_3a0,&local_3c0,"return $o != 0 ? $obj->init(");
      std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      if ((*(byte *)(vectortype._0_8_ + 0x110) & 1) == 0) {
        std::__cxx11::string::operator+=
                  ((string *)vectortype._24_8_,"$this->__indirect($this->__vector($o) + $j * ");
        sVar1 = InlineSize((Type *)local_50);
        NumToString<unsigned_long>(&local_420,sVar1);
        std::operator+(&local_400,&local_420,")");
        std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_420);
      }
      else {
        std::__cxx11::string::operator+=((string *)vectortype._24_8_,"$this->__vector($o) + $j *");
        sVar1 = InlineSize((Type *)local_50);
        NumToString<unsigned_long>(&local_3e0,sVar1);
        std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
      }
      std::__cxx11::string::operator+=((string *)vectortype._24_8_,", $this->bb) : null;\n");
    }
    break;
  case BASE_TYPE_STRUCT:
    if ((struct_def->fixed & 1U) == 0) {
      std::operator+(&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_);
      std::operator+(&local_360,&local_380,"return $o != 0 ? $obj->init(");
      std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_380);
      pcVar2 = "$this->__indirect($o + $this->bb_pos)";
      if ((((field->value).type.struct_def)->fixed & 1U) != 0) {
        pcVar2 = "$o + $this->bb_pos";
      }
      std::__cxx11::string::operator+=((string *)vectortype._24_8_,pcVar2);
      std::__cxx11::string::operator+=((string *)vectortype._24_8_,", $this->bb) : null;\n");
    }
    else {
      std::operator+(&local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      NumToString<unsigned_short>(&local_340,(field->value).offset);
      std::operator+(&local_320,"return $o != 0 ? $obj->init($this->bb_pos +",&local_340);
      std::operator+(&local_300,&local_320,", $this->bb) : null;\n");
      std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
    }
    break;
  case BASE_TYPE_UNION:
    std::operator+(&local_460,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_440,&local_460,"return $o != 0 ? $this->");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    GenGetter_abi_cxx11_(&local_4a0,(PhpGenerator *)&field->value,type_01);
    std::operator+(&local_480,&local_4a0,"($obj, $o); null;\n");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  std::operator+(&local_4c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  return;
}

Assistant:

void GetMemberOfVectorOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    code += Indent + "/**\n";
    code += Indent + " * @return" + GenTypeBasic(field.value.type) + "\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "($j)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$o = $this->__offset(" +
            NumToString(field.value.offset) + ");\n";
    code += Indent + Indent + "$obj = new ";
    code +=
        ConvertCase(GenTypeGet(field.value.type), Case::kUpperCamel) + "();\n";

    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT:
        if (struct_def.fixed) {
          code += Indent + Indent;
          code += "return $o != 0 ? $obj->init($this->bb_pos +" +
                  NumToString(field.value.offset) + ", $this->bb) : null;\n";
        } else {
          code += Indent + Indent + "return $o != 0 ? $obj->init(";
          code += field.value.type.struct_def->fixed
                      ? "$o + $this->bb_pos"
                      : "$this->__indirect($o + $this->bb_pos)";
          code += ", $this->bb) : null;\n";
        }
        break;
      case BASE_TYPE_STRING:
        code += "// base_type_string\n";
        // TODO(chobie): do we need this?
        break;
      case BASE_TYPE_VECTOR:
        if (vectortype.base_type == BASE_TYPE_STRUCT) {
          code += Indent + Indent + "return $o != 0 ? $obj->init(";
          if (vectortype.struct_def->fixed) {
            code += "$this->__vector($o) + $j *";
            code += NumToString(InlineSize(vectortype));
          } else {
            code += "$this->__indirect($this->__vector($o) + $j * ";
            code += NumToString(InlineSize(vectortype)) + ")";
          }
          code += ", $this->bb) : null;\n";
        }
        break;
      case BASE_TYPE_UNION:
        code += Indent + Indent + "return $o != 0 ? $this->";
        code += GenGetter(field.value.type) + "($obj, $o); null;\n";
        break;
      default: break;
    }

    code += Indent + "}\n\n";
  }